

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O3

int main(int argc_,char **argv_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  LogHelper *pLVar7;
  logic_error *this;
  int iVar8;
  int iVar9;
  bool bVar10;
  Range range;
  Range range_00;
  Range range_01;
  Range range_02;
  Range range_03;
  Range range_04;
  Range range_05;
  rep elapsed_ms;
  string local_78;
  long local_58;
  string local_50;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  bVar2 = ParseCommandLine(argc_,argv_);
  if (!bVar2) {
    return 1;
  }
  iVar8 = optind;
  if (optind < argc_) {
    lVar5 = (long)optind;
    iVar8 = optind + 1;
    optind = iVar8;
    strncpy(opt.szSource,argv_[lVar5],0x1ff);
  }
  iVar9 = iVar8;
  if (iVar8 < argc_) {
    iVar9 = iVar8 + 1;
    optind = iVar9;
    strncpy(opt.szTarget,argv_[iVar8],0x1ff);
  }
  local_58 = lVar4;
  if (argc_ <= iVar9) {
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(opt.szSource);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
    uVar3 = GetArgType(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(opt.szTarget);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,0x1deac8,sVar6 + 0x1deac8);
    iVar8 = GetArgType(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    lVar4 = local_58;
    switch(opt.command) {
    case 0:
      if ((uVar3 != 0) && (iVar8 != 0)) {
        if (uVar3 == 4) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1deac8,sVar6 + 0x1deac8);
          bVar2 = IsTrinity(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_78._M_dataplus._M_p = (pointer)paVar1;
            sVar6 = strlen(opt.szSource);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            sVar6 = strlen(opt.szTarget);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
            bVar2 = Image2Trinity(&local_78,&local_50);
            goto LAB_001686c2;
          }
LAB_00168383:
          if ((iVar8 == 4) || (iVar8 == 2)) {
            local_78._M_dataplus._M_p = (pointer)paVar1;
            sVar6 = strlen(opt.szSource);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            sVar6 = strlen(opt.szTarget);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
            bVar2 = ImageToImage(&local_78,&local_50);
            goto LAB_001686c2;
          }
        }
        else if (uVar3 == 1) goto LAB_00168383;
        if (iVar8 == 2 && uVar3 - 1 < 2) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
          bVar2 = Hdd2Hdd(&local_78,&local_50);
        }
        else if (iVar8 == 4 && uVar3 == 3) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
          bVar2 = Hdd2Boot(&local_78,&local_50);
        }
        else if (iVar8 == 3 && uVar3 == 4) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
          bVar2 = Boot2Hdd(&local_78,&local_50);
        }
        else {
          if ((uVar3 != 3) || (iVar8 != 3)) break;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
          bVar2 = Boot2Boot(&local_78,&local_50);
        }
LAB_001686c2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
LAB_0016872a:
        lVar4 = local_58;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          lVar4 = local_58;
        }
LAB_00168745:
        if (opt.time != 0) {
          lVar5 = std::chrono::_V2::system_clock::now();
          local_78._M_dataplus._M_p = (pointer)((lVar5 - lVar4) / 1000000);
          pLVar7 = util::operator<<((LogHelper *)&util::cout,(char (*) [15])"Elapsed time: ");
          pLVar7 = util::operator<<(pLVar7,(long *)&local_78);
          util::operator<<(pLVar7,(char (*) [4])"ms\n");
        }
        pLVar7 = util::operator<<((LogHelper *)&util::cout,none);
        util::operator<<(pLVar7,(char (*) [1])0x1ad061);
        std::ofstream::close();
        return (uint)(bVar2 ^ 1);
      }
      break;
    case 1:
      if (((uVar3 != 0) && (iVar8 == 0)) && ((uVar3 == 4 || (uVar3 == 1)))) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(opt.szSource);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
        range_00.head_begin = opt.range.head_begin;
        range_00.head_end = opt.range.head_end;
        range_00.cyl_begin = opt.range.cyl_begin;
        range_00.cyl_end = opt.range.cyl_end;
        bVar2 = ScanImage(&local_78,range_00);
        goto LAB_0016872a;
      }
      break;
    case 2:
      if ((uVar3 != 0) && (iVar8 == 0)) {
        if (uVar3 == 4) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          range_03.head_begin = opt.range.head_begin;
          range_03.head_end = opt.range.head_end;
          range_03.cyl_begin = opt.range.cyl_begin;
          range_03.cyl_end = opt.range.cyl_end;
          FormatImage(&local_78,range_03);
        }
        else if (uVar3 == 3) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          FormatBoot(&local_78);
        }
        else {
          if (uVar3 != 2) break;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          FormatHdd(&local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
        lVar4 = local_58;
        goto LAB_00168745;
      }
      break;
    case 3:
      if (iVar8 == 0) {
        if (uVar3 == 0) {
          bVar2 = ListDrives(opt.verbose);
          goto LAB_00168745;
        }
        if (uVar3 < 3) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = ListRecords(&local_78);
        }
        else {
          if (uVar3 != 4) break;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = DirImage(&local_78);
        }
        goto LAB_0016872a;
      }
      break;
    case 4:
      if ((uVar3 != 0) && (iVar8 == 0)) {
        if (uVar3 - 1 < 2) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          range.head_begin = opt.range.head_begin;
          range.head_end = opt.range.head_end;
          range.cyl_begin = opt.range.cyl_begin;
          range.cyl_end = opt.range.cyl_end;
          bVar2 = ViewHdd(&local_78,range);
        }
        else if (uVar3 == 3) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          range_02.head_begin = opt.range.head_begin;
          range_02.head_end = opt.range.head_end;
          range_02.cyl_begin = opt.range.cyl_begin;
          range_02.cyl_end = opt.range.cyl_end;
          bVar2 = ViewBoot(&local_78,range_02);
        }
        else {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          range_04.head_begin = opt.range.head_begin;
          range_04.head_end = opt.range.head_end;
          range_04.cyl_begin = opt.range.cyl_begin;
          range_04.cyl_end = opt.range.cyl_end;
          bVar2 = ViewImage(&local_78,range_04);
        }
        goto LAB_0016872a;
      }
      break;
    case 5:
      if ((uVar3 != 0) && (iVar8 == 0)) {
        if (uVar3 - 1 < 2) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = HddInfo(&local_78,opt.verbose);
        }
        else {
          if (uVar3 != 4) break;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = ImageInfo(&local_78);
        }
        goto LAB_0016872a;
      }
      break;
    case 6:
      if ((uVar3 != 0) && (iVar8 == 0)) {
        if (uVar3 == 4) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = DirImage(&local_78);
        }
        else {
          if (uVar3 != 2) break;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = ListRecords(&local_78);
        }
        goto LAB_0016872a;
      }
      break;
    case 7:
      if ((uVar3 == 4) && (iVar8 == 0)) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(opt.szSource);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
        bVar2 = DiskRpm(&local_78);
        goto LAB_0016872a;
      }
      break;
    case 8:
      goto switchD_00167df2_caseD_8;
    case 9:
      if ((uVar3 != 0) && (iVar8 == 0)) {
        opt.nosig = 1;
        if (uVar3 == 2) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = FormatHdd(&local_78);
        }
        else {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          bVar2 = IsRecord(&local_78,(int *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_78._M_dataplus._M_p = (pointer)paVar1;
            sVar6 = strlen(opt.szSource);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
            bVar2 = FormatRecord(&local_78);
          }
          else {
            if (uVar3 != 4) break;
            local_78._M_dataplus._M_p = (pointer)paVar1;
            sVar6 = strlen(opt.szSource);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
            range_05.head_begin = opt.range.head_begin;
            range_05.head_end = opt.range.head_end;
            range_05.cyl_begin = opt.range.cyl_begin;
            range_05.cyl_end = opt.range.cyl_end;
            bVar2 = UnformatImage(&local_78,range_05);
          }
        }
        goto LAB_0016872a;
      }
      break;
    case 10:
      if (iVar8 == 0 && uVar3 == 0) {
        Version();
        ReportTypes();
        bVar2 = true;
        ReportBuildOptions();
        goto LAB_00168745;
      }
      break;
    case 0xb:
      if (uVar3 == 2) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(opt.szSource);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
        bVar2 = IsHddImage(&local_78);
        bVar10 = opt.sectors != -1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (bVar2 && (bVar10 || iVar8 != 0)) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(opt.szSource);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar6 = strlen(opt.szTarget);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,0x1deac8,sVar6 + 0x1deac8);
          iVar8 = util::str_value<int>(&local_50);
          bVar2 = CreateHddImage(&local_78,iVar8);
          goto LAB_001686c2;
        }
      }
      else if (((uVar3 != 0) && (uVar3 == 4)) && (iVar8 == 0)) {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(opt.szSource);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,0x1de8c8,sVar6 + 0x1de8c8);
        range_01.head_begin = opt.range.head_begin;
        range_01.head_end = opt.range.head_end;
        range_01.cyl_begin = opt.range.cyl_begin;
        range_01.cyl_end = opt.range.cyl_end;
        bVar2 = CreateImage(&local_78,range_01);
        goto LAB_0016872a;
      }
    }
    Usage();
  }
  Usage();
switchD_00167df2_caseD_8:
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"verify command not yet implemented");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int main(int argc_, char* argv_[])
{
    auto start_time = std::chrono::system_clock::now();

#ifdef _WIN32
#ifdef _DEBUG
    _CrtSetDbgFlag(_CrtSetDbgFlag(_CRTDBG_REPORT_FLAG) | _CRTDBG_LEAK_CHECK_DF);
#endif

    SetUnhandledExceptionFilter(CrashDumpUnhandledExceptionFilter);

#ifndef _DEBUG
    // Check if we've been run from GUI mode with no arguments
    if (!IsConsoleWindow() && util::is_stdout_a_tty() && argc_ == 1)
    {
        FreeConsole();

        char szPath[MAX_PATH];
        GetModuleFileName(GetModuleHandle(NULL), szPath, ARRAYSIZE(szPath));

        auto strCommand = std::string("/k \"") + szPath + "\" --help";
        GetEnvironmentVariable("COMSPEC", szPath, ARRAYSIZE(szPath));

        auto ret = static_cast<int>(reinterpret_cast<ULONG_PTR>(
            ShellExecute(NULL, "open", szPath, strCommand.c_str(), NULL, SW_NORMAL)));

        // Fall back on the old message if it failed
        if (ret < 32)
            MessageBox(nullptr, "I'm a console-mode utility, please run me from a Command Prompt!", "SAMdisk", MB_OK | MB_ICONSTOP);

        return 0;
    }
#endif // _DEBUG
#endif // _WIN32

    bool f = false;

    try
    {
        if (!ParseCommandLine(argc_, argv_))
            return 1;

        // Read at most two non-option command-line arguments
        if (optind < argc_) strncpy(opt.szSource, argv_[optind++], arraysize(opt.szSource) - 1);
        if (optind < argc_) strncpy(opt.szTarget, argv_[optind++], arraysize(opt.szTarget) - 1);
        if (optind < argc_) Usage();

        int nSource = GetArgType(opt.szSource);
        int nTarget = GetArgType(opt.szTarget);

        switch (opt.command)
        {
        case cmdCopy:
        {
            if (nSource == argNone || nTarget == argNone)
                Usage();

            if (nSource == argDisk && IsTrinity(opt.szTarget))
                f = Image2Trinity(opt.szSource, opt.szTarget);          // file/image -> Trinity
            else if ((nSource == argBlock || nSource == argDisk) && (nTarget == argDisk || nTarget == argHDD /*for .raw*/))
                f = ImageToImage(opt.szSource, opt.szTarget);           // image -> image
            else if ((nSource == argHDD || nSource == argBlock) && nTarget == argHDD)
                f = Hdd2Hdd(opt.szSource, opt.szTarget);                // hdd -> hdd
            else if (nSource == argBootSector && nTarget == argDisk)
                f = Hdd2Boot(opt.szSource, opt.szTarget);               // boot -> file
            else if (nSource == argDisk && nTarget == argBootSector)
                f = Boot2Hdd(opt.szSource, opt.szTarget);               // file -> boot
            else if (nSource == argBootSector && nTarget == argBootSector)
                f = Boot2Boot(opt.szSource, opt.szTarget);              // boot -> boot
            else
                Usage();

            break;
        }

        case cmdList:
        {
            if (nTarget != argNone)
                Usage();

            if (nSource == argNone)
                f = ListDrives(opt.verbose);
            else if (nSource == argHDD || nSource == argBlock)
                f = ListRecords(opt.szSource);
            else if (nSource == argDisk)
                f = DirImage(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdDir:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();
#if 0
            if (nSource == argFloppy)
                f = DirFloppy(opt.szSource);
            else
#endif
                if (nSource == argHDD)
                    f = ListRecords(opt.szSource);
                else if (nSource == argDisk)
                    f = DirImage(opt.szSource);
                else
                    Usage();

            break;
        }

        case cmdScan:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argBlock || nSource == argDisk)
                f = ScanImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdUnformat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            // Don't write disk signatures during any formatting
            opt.nosig = true;

            if (nSource == argHDD)
                f = FormatHdd(opt.szSource);
            else if (IsRecord(opt.szSource))
                f = FormatRecord(opt.szSource);
            else if (nSource == argDisk)
                f = UnformatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdFormat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD)
                FormatHdd(opt.szSource);
            else if (nSource == argBootSector)
                FormatBoot(opt.szSource);
            else if (nSource == argDisk)
                FormatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdVerify:
            throw std::logic_error("verify command not yet implemented");

        case cmdCreate:
        {
            if (nSource == argNone)
                Usage();

            if (nSource == argHDD && IsHddImage(opt.szSource) && (nTarget != argNone || opt.sectors != -1))
                f = CreateHddImage(opt.szSource, util::str_value<int>(opt.szTarget));
            else if (nSource == argDisk && nTarget == argNone)
                f = CreateImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdInfo:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = HddInfo(opt.szSource, opt.verbose);
            else if (nSource == argDisk)
                f = ImageInfo(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdView:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = ViewHdd(opt.szSource, opt.range);
            else if (nSource == argBootSector)
                f = ViewBoot(opt.szSource, opt.range);
            else if (nSource == argDisk)
                f = ViewImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdRpm:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argDisk)
                f = DiskRpm(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdVersion:
        {
            if (nSource != argNone || nTarget != argNone)
                Usage();

            LongVersion();
            f = true;
            break;
        }

        default:
            Usage();
            break;
        }
    }
    catch (std::string & e)
    {
        util::cout << "Error: " << colour::RED << e << colour::none << '\n';
    }
    catch (util::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::system_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::logic_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#ifndef _WIN32
    catch (std::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#endif

    if (opt.time)
    {
        auto end_time = std::chrono::system_clock::now();
        auto elapsed_ms = std::chrono::duration_cast<std::chrono::milliseconds>(end_time - start_time).count();
        util::cout << "Elapsed time: " << elapsed_ms << "ms\n";
    }

    util::cout << colour::none << "";
    util::log.close();

    return f ? 0 : 1;
}